

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

void Sfm_LibPrint(Sfm_Lib_t *p)

{
  word *pTruth;
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  Vec_Mem_t *pVVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  word *pwVar13;
  ulong uVar14;
  word *pwVar15;
  int nVarsInit;
  
  pVVar5 = p->vTtMem;
  if (0 < pVVar5->nEntries) {
    uVar9 = 0;
    do {
      if (pVVar5->ppPages[(uint)uVar9 >> ((byte)pVVar5->LogPageSze & 0x1f)] == (word *)0x0) {
        return;
      }
      if (1 < uVar9) {
        if ((long)(p->vHits).nSize <= (long)uVar9) {
LAB_00537bdd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((p->vHits).pArray[uVar9] != 0) {
          pTruth = pVVar5->ppPages[(uint)uVar9 >> ((byte)pVVar5->LogPageSze & 0x1f)] +
                   (int)((pVVar5->PageMask & (uint)uVar9) * pVVar5->nEntrySize);
          uVar1 = p->nVars;
          if ((long)(int)uVar1 < 1) {
            nVarsInit = 0;
          }
          else {
            iVar3 = uVar1 - 6;
            uVar7 = 1 << ((byte)iVar3 & 0x1f);
            uVar2 = uVar7;
            if ((int)uVar7 < 2) {
              uVar2 = 1;
            }
            uVar8 = 0;
            nVarsInit = 0;
            do {
              if (uVar1 < 7) {
                if ((s_Truths6Neg[uVar8] &
                    (*pTruth >> ((byte)(1 << ((byte)uVar8 & 0x1f)) & 0x3f) ^ *pTruth)) != 0) {
LAB_00537a49:
                  nVarsInit = nVarsInit + 1;
                }
              }
              else if (uVar8 < 6) {
                if (iVar3 != 0x1f) {
                  uVar12 = 0;
                  do {
                    if (((pTruth[uVar12] >> ((byte)(1 << ((byte)uVar8 & 0x1f)) & 0x3f) ^
                         pTruth[uVar12]) & s_Truths6Neg[uVar8]) != 0) goto LAB_00537a49;
                    uVar12 = uVar12 + 1;
                  } while (uVar2 != uVar12);
                }
              }
              else if (iVar3 != 0x1f) {
                bVar6 = (byte)(uVar8 - 6);
                uVar10 = 1 << (bVar6 & 0x1f);
                iVar11 = 2 << (bVar6 & 0x1f);
                uVar12 = 1;
                if (1 < (int)uVar10) {
                  uVar12 = (ulong)uVar10;
                }
                pwVar13 = pTruth + (int)uVar10;
                pwVar15 = pTruth;
                do {
                  if (uVar8 - 6 != 0x1f) {
                    uVar14 = 0;
                    do {
                      if (pwVar15[uVar14] != pwVar13[uVar14]) goto LAB_00537a49;
                      uVar14 = uVar14 + 1;
                    } while (uVar12 != uVar14);
                  }
                  pwVar15 = pwVar15 + iVar11;
                  pwVar13 = pwVar13 + iVar11;
                } while (pwVar15 < pTruth + (int)uVar7);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != (long)(int)uVar1);
          }
          printf("%8d : ",uVar9 & 0xffffffff);
          if ((((long)(p->vCounts).nSize <= (long)uVar9) ||
              (printf("Num =%5d  ",(ulong)(uint)(p->vCounts).pArray[uVar9]),
              (long)(p->vHits).nSize <= (long)uVar9)) ||
             (printf("Hit =%4d  ",(ulong)(uint)(p->vHits).pArray[uVar9]),
             (long)(p->vLists).nSize <= (long)uVar9)) goto LAB_00537bdd;
          lVar4 = (long)(p->vLists).pArray[uVar9];
          if ((lVar4 != -1) && (p->pObjs != (Sfm_Fun_t *)0x0)) {
            Sfm_LibPrintObj(p,p->pObjs + lVar4);
          }
          printf("    ");
          Dau_DsdPrintFromTruth(pTruth,nVarsInit);
          pVVar5 = p->vTtMem;
        }
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)pVVar5->nEntries);
  }
  return;
}

Assistant:

void Sfm_LibPrint( Sfm_Lib_t * p )
{
    Sfm_Fun_t * pObj; word * pTruth; int i, nFanins;   
    Vec_MemForEachEntry( p->vTtMem, pTruth, i )
    {
        if ( i < 2 || Vec_IntEntry(&p->vHits, i) == 0 )
            continue;
        nFanins = Abc_TtSupportSize(pTruth, p->nVars);
        printf( "%8d : ", i );
        printf( "Num =%5d  ", Vec_IntEntry(&p->vCounts, i) );
        printf( "Hit =%4d  ", Vec_IntEntry(&p->vHits, i) );
        Sfm_LibForEachSuper( p, pObj, i )
        {
            Sfm_LibPrintObj( p, pObj );
            break;
        }
        printf( "    " );
        Dau_DsdPrintFromTruth( pTruth, nFanins );
    }
}